

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::LogMessage::~LogMessage(LogMessage *this)

{
  LogMessage *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_message);
  std::__cxx11::string::~string((string *)&this->m_func);
  std::__cxx11::string::~string((string *)&this->m_file);
  return;
}

Assistant:

LogMessage(Level level, const std::string& file, base::type::LineNumber line, const std::string& func,
             base::type::VerboseLevel verboseLevel, Logger* logger) :
    m_level(level), m_file(file), m_line(line), m_func(func),
    m_verboseLevel(verboseLevel), m_logger(logger), m_message(logger->stream().str()) {
  }